

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_i_like_cfd_grid(REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  REF_STATUS RVar2;
  uint uVar3;
  FILE *__stream;
  void *__ptr;
  void *__ptr_00;
  REF_INT *c2n_00;
  REF_INT *order_00;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  int local_f8;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_INT edge;
  REF_INT nedge;
  REF_INT nquad;
  REF_INT ntri;
  REF_INT id;
  REF_INT max_id;
  REF_INT min_id;
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL ref_cell;
  REF_INT nnode;
  REF_INT *order;
  REF_INT *c2n;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_INT node;
  REF_NODE ref_node;
  FILE *f;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  if (ref_grid->twod == 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0xa42,
           "ref_export_i_like_cfd_grid","expected twod convention grid");
    ref_grid_local._4_4_ = 1;
  }
  else {
    __stream = fopen(filename,"w");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0xa46,"ref_export_i_like_cfd_grid","unable to open file");
      ref_grid_local._4_4_ = 2;
    }
    else if (pRVar1->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0xa48,"ref_export_i_like_cfd_grid","malloc o2n of REF_INT negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      __ptr = malloc((long)pRVar1->max << 2);
      if (__ptr == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0xa48,"ref_export_i_like_cfd_grid","malloc o2n of REF_INT NULL");
        ref_grid_local._4_4_ = 2;
      }
      else {
        for (local_f8 = 0; local_f8 < pRVar1->max; local_f8 = local_f8 + 1) {
          *(undefined4 *)((long)__ptr + (long)local_f8 * 4) = 0xffffffff;
        }
        if (pRVar1->max < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0xa49,"ref_export_i_like_cfd_grid","malloc n2o of REF_INT negative");
          ref_grid_local._4_4_ = 1;
        }
        else {
          __ptr_00 = malloc((long)pRVar1->max << 2);
          if (__ptr_00 == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0xa49,"ref_export_i_like_cfd_grid","malloc n2o of REF_INT NULL");
            ref_grid_local._4_4_ = 2;
          }
          else {
            for (ref_private_status_reis_ai._4_4_ = 0;
                ref_private_status_reis_ai._4_4_ < pRVar1->max;
                ref_private_status_reis_ai._4_4_ = ref_private_status_reis_ai._4_4_ + 1) {
              *(undefined4 *)((long)__ptr_00 + (long)ref_private_status_reis_ai._4_4_ * 4) =
                   0xffffffff;
            }
            ref_cell._4_4_ = 0;
            for (o2n._4_4_ = 0; o2n._4_4_ < pRVar1->max; o2n._4_4_ = o2n._4_4_ + 1) {
              if (((-1 < o2n._4_4_) && (o2n._4_4_ < pRVar1->max)) &&
                 (-1 < pRVar1->global[o2n._4_4_])) {
                *(uint *)((long)__ptr + (long)o2n._4_4_ * 4) = ref_cell._4_4_;
                *(int *)((long)__ptr_00 + (long)(int)ref_cell._4_4_ * 4) = o2n._4_4_;
                ref_cell._4_4_ = ref_cell._4_4_ + 1;
              }
            }
            fprintf(__stream,"%d %d %d\n",(ulong)ref_cell._4_4_,(ulong)(uint)ref_grid->cell[3]->n,
                    (ulong)(uint)ref_grid->cell[6]->n);
            for (o2n._4_4_ = 0; o2n._4_4_ < (int)ref_cell._4_4_; o2n._4_4_ = o2n._4_4_ + 1) {
              fprintf(__stream,"%.16E %.16E\n",
                      pRVar1->real[*(int *)((long)__ptr_00 + (long)o2n._4_4_ * 4) * 0xf],
                      pRVar1->real[*(int *)((long)__ptr_00 + (long)o2n._4_4_ * 4) * 0xf + 1]);
            }
            unique0x00012000 = ref_grid->cell[3];
            nedge = 0;
            for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffff98->max;
                nodes[0x19] = nodes[0x19] + 1) {
              RVar2 = ref_cell_nodes(stack0xffffffffffffff98,nodes[0x19],&max_id);
              if (RVar2 == 0) {
                nedge = nedge + 1;
                fprintf(__stream,"%d %d %d\n",(ulong)(*(int *)((long)__ptr + (long)max_id * 4) + 1),
                        (ulong)(*(int *)((long)__ptr + (long)min_id * 4) + 1),
                        (ulong)(*(int *)((long)__ptr + (long)nodes[0] * 4) + 1));
              }
            }
            if ((long)nedge == (long)stack0xffffffffffffff98->n) {
              unique0x00012000 = ref_grid->cell[6];
              for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffff98->max;
                  nodes[0x19] = nodes[0x19] + 1) {
                RVar2 = ref_cell_nodes(stack0xffffffffffffff98,nodes[0x19],&max_id);
                if (RVar2 == 0) {
                  fprintf(__stream,"%d %d %d %d\n",
                          (ulong)(*(int *)((long)__ptr + (long)max_id * 4) + 1),
                          (ulong)(*(int *)((long)__ptr + (long)min_id * 4) + 1),
                          (ulong)(*(int *)((long)__ptr + (long)nodes[0] * 4) + 1),
                          (ulong)(*(int *)((long)__ptr + (long)nodes[1] * 4) + 1));
                }
              }
              if ((long)stack0xffffffffffffff98->n == 0) {
                unique0x00012000 = ref_grid->cell[0];
                ref_grid_local._4_4_ = ref_cell_id_range(unique0x00012000,ref_grid->mpi,&id,&ntri);
                if (ref_grid_local._4_4_ == 0) {
                  fprintf(__stream,"%d\n",(ulong)((ntri - id) + 1));
                  for (nquad = id; nquad <= ntri; nquad = nquad + 1) {
                    ref_malloc_init_i = 0;
                    for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffff98->max;
                        nodes[0x19] = nodes[0x19] + 1) {
                      RVar2 = ref_cell_nodes(stack0xffffffffffffff98,nodes[0x19],&max_id);
                      if ((RVar2 == 0) && (nodes[0] == nquad)) {
                        ref_malloc_init_i = ref_malloc_init_i + 1;
                      }
                    }
                    fprintf(__stream,"%d\n",(ulong)(ref_malloc_init_i + 1));
                  }
                  if (stack0xffffffffffffff98->n * 2 < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                           ,0xa7a,"ref_export_i_like_cfd_grid","malloc c2n of REF_INT negative");
                    ref_grid_local._4_4_ = 1;
                  }
                  else {
                    c2n_00 = (REF_INT *)malloc((long)(stack0xffffffffffffff98->n << 1) << 2);
                    if (c2n_00 == (REF_INT *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0xa7a,"ref_export_i_like_cfd_grid","malloc c2n of REF_INT NULL");
                      ref_grid_local._4_4_ = 2;
                    }
                    else if (stack0xffffffffffffff98->n < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0xa7b,"ref_export_i_like_cfd_grid","malloc order of REF_INT negative")
                      ;
                      ref_grid_local._4_4_ = 1;
                    }
                    else {
                      order_00 = (REF_INT *)malloc((long)stack0xffffffffffffff98->n << 2);
                      if (order_00 == (REF_INT *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0xa7b,"ref_export_i_like_cfd_grid","malloc order of REF_INT NULL");
                        ref_grid_local._4_4_ = 2;
                      }
                      else {
                        for (nquad = id; nquad <= ntri; nquad = nquad + 1) {
                          ref_malloc_init_i = 0;
                          for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffff98->max;
                              nodes[0x19] = nodes[0x19] + 1) {
                            RVar2 = ref_cell_nodes(stack0xffffffffffffff98,nodes[0x19],&max_id);
                            if ((RVar2 == 0) && (nodes[0] == nquad)) {
                              uVar3 = ref_grid_orient_edg(ref_grid,&max_id);
                              if (uVar3 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                       ,0xa80,"ref_export_i_like_cfd_grid",(ulong)uVar3,
                                       "orient based on tri");
                                return uVar3;
                              }
                              c2n_00[ref_malloc_init_i << 1] = max_id;
                              c2n_00[ref_malloc_init_i * 2 + 1] = min_id;
                              ref_malloc_init_i = ref_malloc_init_i + 1;
                            }
                          }
                          if (0 < ref_malloc_init_i) {
                            uVar3 = ref_export_order_segments(ref_malloc_init_i,c2n_00,order_00);
                            if (uVar3 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                     ,0xa87,"ref_export_i_like_cfd_grid",(ulong)uVar3,"order");
                              return uVar3;
                            }
                            fprintf(__stream,"%d\n",
                                    (ulong)(*(int *)((long)__ptr + (long)c2n_00[*order_00 << 1] * 4)
                                           + 1));
                            for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < ref_malloc_init_i;
                                ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                              fprintf(__stream,"%d\n",
                                      (ulong)(*(int *)((long)__ptr +
                                                      (long)c2n_00[order_00[ref_malloc_init_i_1] * 2
                                                                   + 1] * 4) + 1));
                            }
                          }
                        }
                        if (order_00 != (REF_INT *)0x0) {
                          free(order_00);
                        }
                        if (c2n_00 != (REF_INT *)0x0) {
                          free(c2n_00);
                        }
                        if (__ptr_00 != (void *)0x0) {
                          free(__ptr_00);
                        }
                        if (__ptr != (void *)0x0) {
                          free(__ptr);
                        }
                        fclose(__stream);
                        ref_grid_local._4_4_ = 0;
                      }
                    }
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0xa6e,"ref_export_i_like_cfd_grid",(ulong)ref_grid_local._4_4_,"id range")
                  ;
                }
              }
              else {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0xa6a,"ref_export_i_like_cfd_grid","quad miscount",0,
                       (long)stack0xffffffffffffff98->n);
                ref_grid_local._4_4_ = 1;
              }
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0xa61,"ref_export_i_like_cfd_grid","triangle miscount",(long)nedge,
                     (long)stack0xffffffffffffff98->n);
              ref_grid_local._4_4_ = 1;
            }
          }
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_i_like_cfd_grid(REF_GRID ref_grid,
                                                     const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  REF_INT *o2n, *n2o, *c2n, *order;
  REF_INT nnode;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT min_id, max_id, id;
  REF_INT ntri, nquad, nedge, edge;

  RAS(ref_grid_twod(ref_grid), "expected twod convention grid");

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(n2o, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    o2n[node] = nnode;
    n2o[nnode] = node;
    nnode++;
  }

  fprintf(f, "%d %d %d\n", nnode, ref_cell_n(ref_grid_tri(ref_grid)),
          ref_cell_n(ref_grid_qua(ref_grid)));

  for (node = 0; node < nnode; node++) {
    fprintf(f, "%.16E %.16E\n", ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]));
  }

  ref_cell = ref_grid_tri(ref_grid);
  ntri = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    ntri++;
    fprintf(f, "%d %d %d\n", o2n[nodes[0]] + 1, o2n[nodes[1]] + 1,
            o2n[nodes[2]] + 1);
  }
  REIS(ntri, ref_cell_n(ref_cell), "triangle miscount");

  ref_cell = ref_grid_qua(ref_grid);
  nquad = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    ntri++;
    fprintf(f, "%d %d %d %d\n", o2n[nodes[0]] + 1, o2n[nodes[1]] + 1,
            o2n[nodes[2]] + 1, o2n[nodes[3]] + 1);
  }
  REIS(nquad, ref_cell_n(ref_cell), "quad miscount");

  ref_cell = ref_grid_edg(ref_grid);
  RSS(ref_cell_id_range(ref_cell, ref_grid_mpi(ref_grid), &min_id, &max_id),
      "id range");
  fprintf(f, "%d\n", max_id - min_id + 1);
  for (id = min_id; id <= max_id; id++) {
    nedge = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[2] == id) {
        nedge++;
      }
    }
    fprintf(f, "%d\n", nedge + 1); /* +1, both end points */
  }

  ref_malloc(c2n, 2 * ref_cell_n(ref_cell), REF_INT);
  ref_malloc(order, ref_cell_n(ref_cell), REF_INT);
  for (id = min_id; id <= max_id; id++) {
    nedge = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[2] == id) {
        RSS(ref_grid_orient_edg(ref_grid, nodes), "orient based on tri");
        c2n[0 + 2 * nedge] = nodes[0];
        c2n[1 + 2 * nedge] = nodes[1];
        nedge++;
      }
    }
    if (nedge > 0) {
      RSS(ref_export_order_segments(nedge, c2n, order), "order");
      fprintf(f, "%d\n", o2n[c2n[0 + 2 * order[0]]] + 1);
      for (edge = 0; edge < nedge; edge++) {
        fprintf(f, "%d\n", o2n[c2n[1 + 2 * order[edge]]] + 1);
      }
    }
  }

  ref_free(order);
  ref_free(c2n);
  ref_free(n2o);
  ref_free(o2n);

  fclose(f);

  return REF_SUCCESS;
}